

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internals.h
# Opt level: O1

uint32_t arm_debug_exception_fsr(CPUARMState_conflict *env)

{
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  bool bVar8;
  
  uVar1 = env->features;
  if ((uVar1 & 0x200000000) == 0) {
    bVar8 = false;
  }
  else {
    if (env->aarch64 == 0) {
      bVar8 = (env->uncached_cpsr & 0x1f) == 0x16;
    }
    else {
      bVar8 = (~env->pstate & 0xc) == 0;
    }
    if (!bVar8) {
      bVar8 = ((env->cp15).scr_el3 & 1) == 0;
    }
  }
  uVar3 = (uint)uVar1;
  if (((uVar1 >> 0x20 & 1) == 0) || (bVar8)) {
LAB_0062f6cb:
    if (((uVar1 & 0x200000000) != 0) && ((bool)((uVar3 >> 0x1c & 1) == 0 & bVar8))) {
      iVar4 = 3;
      bVar8 = true;
      bVar2 = false;
      goto LAB_0062f6f4;
    }
    iVar4 = 1;
    bVar2 = false;
  }
  else {
    iVar4 = 2;
    bVar2 = true;
    if ((((env->cp15).hcr_el2 & 0x8000000) == 0) && (((env->cp15).mdcr_el2 & 0x100) == 0))
    goto LAB_0062f6cb;
  }
  bVar8 = false;
LAB_0062f6f4:
  if (!bVar2) {
    uVar5 = (uVar3 & 0x10000000) >> 0x1c;
    uVar7 = (ulong)uVar5;
    if (!bVar8) {
      uVar6 = 0;
      if ((uVar1 & 0x200000000) == 0) {
        uVar6 = uVar5;
      }
      if ((~uVar1 & 0x210000000) == 0) {
        uVar6 = (uint)(env->cp15).scr_el3 >> 10;
      }
      uVar7 = (ulong)uVar6;
      if (((uVar1 >> 0x20 & 1) != 0) &&
         (((uVar1 & 0x200000000) == 0 || (((env->cp15).scr_el3 & 1) != 0)))) {
        if ((uVar6 & 1) == 0) {
          uVar7 = 0;
        }
        else {
          uVar7 = (env->cp15).hcr_el2 >> 0x1f;
        }
      }
    }
    if ((uVar7 & 1) == 0) {
      if ((uVar3 >> 0x1a & 1) == 0) {
        return 2;
      }
      if ((*(byte *)((long)&(env->cp15).tcr_el[0].raw_tcr + (ulong)(uint)(iVar4 << 4) + 3) & 0x80)
          == 0) {
        return 2;
      }
    }
  }
  return 0x222;
}

Assistant:

static inline uint32_t arm_debug_exception_fsr(CPUARMState *env)
{
    ARMMMUFaultInfo fi = { .type = ARMFault_Debug };
    int target_el = arm_debug_target_el(env);
    bool using_lpae = false;

    if (target_el == 2 || arm_el_is_aa64(env, target_el)) {
        using_lpae = true;
    } else {
        if (arm_feature(env, ARM_FEATURE_LPAE) &&
            (env->cp15.tcr_el[target_el].raw_tcr & TTBCR_EAE)) {
            using_lpae = true;
        }
    }

    if (using_lpae) {
        return arm_fi_to_lfsc(&fi);
    } else {
        return arm_fi_to_sfsc(&fi);
    }
}